

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

double __thiscall
HighsPseudocost::getPseudocostUp(HighsPseudocost *this,HighsInt col,double frac,double offset)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int in_ESI;
  HighsPseudocost *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double weightPs;
  double cost;
  double up;
  double local_48;
  double local_30;
  
  dVar4 = ceil(in_XMM0_Qa);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesup,(long)in_ESI);
  if (*pvVar2 != 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesup,(long)in_ESI);
    if (in_RDI->minreliable <= *pvVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->pseudocostup,(long)in_ESI);
      local_30 = *pvVar3;
      goto LAB_0060b8ff;
    }
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesup,(long)in_ESI);
  if (*pvVar2 == 0) {
    local_48 = 0.0;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nsamplesup,(long)in_ESI);
    local_48 = ((double)*pvVar2 * 0.1) / (double)in_RDI->minreliable + 0.9;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->pseudocostup,(long)in_ESI);
  dVar1 = *pvVar3;
  dVar5 = getAvgPseudocost(in_RDI);
  local_30 = (1.0 - local_48) * dVar5 + local_48 * dVar1;
LAB_0060b8ff:
  return (dVar4 - in_XMM0_Qa) * (in_XMM1_Qa + local_30);
}

Assistant:

double getPseudocostUp(HighsInt col, double frac, double offset) const {
    double up = std::ceil(frac) - frac;
    double cost;

    if (nsamplesup[col] == 0 || nsamplesup[col] < minreliable) {
      double weightPs =
          nsamplesup[col] == 0
              ? 0
              : 0.9 + 0.1 * nsamplesup[col] / static_cast<double>(minreliable);
      cost = weightPs * pseudocostup[col];
      cost += (1.0 - weightPs) * getAvgPseudocost();
    } else
      cost = pseudocostup[col];
    return up * (offset + cost);
  }